

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O1

uint256 * __thiscall
XOnlyPubKey::ComputeTapTweakHash
          (uint256 *__return_storage_ptr__,XOnlyPubKey *this,uint256 *merkle_root)

{
  base_blob<256U> *pbVar1;
  long lVar2;
  uint32_t *puVar3;
  CSHA256 *pCVar4;
  long in_FS_OFFSET;
  CSHA256 CStack_88;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (merkle_root == (uint256 *)0x0) {
    puVar3 = (uint32_t *)&HASHER_TAPTWEAK;
    pCVar4 = &CStack_88;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pCVar4 = *(undefined8 *)puVar3;
      puVar3 = puVar3 + 2;
      pCVar4 = (CSHA256 *)((long)pCVar4 + 8);
    }
    CSHA256::Write(&CStack_88,(uchar *)this,0x20);
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar1->m_data)._M_elems[8] = '\0';
    (pbVar1->m_data)._M_elems[9] = '\0';
    (pbVar1->m_data)._M_elems[10] = '\0';
    (pbVar1->m_data)._M_elems[0xb] = '\0';
    (pbVar1->m_data)._M_elems[0xc] = '\0';
    (pbVar1->m_data)._M_elems[0xd] = '\0';
    (pbVar1->m_data)._M_elems[0xe] = '\0';
    (pbVar1->m_data)._M_elems[0xf] = '\0';
    pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar1->m_data)._M_elems[0x10] = '\0';
    (pbVar1->m_data)._M_elems[0x11] = '\0';
    (pbVar1->m_data)._M_elems[0x12] = '\0';
    (pbVar1->m_data)._M_elems[0x13] = '\0';
    (pbVar1->m_data)._M_elems[0x14] = '\0';
    (pbVar1->m_data)._M_elems[0x15] = '\0';
    (pbVar1->m_data)._M_elems[0x16] = '\0';
    (pbVar1->m_data)._M_elems[0x17] = '\0';
    pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar1->m_data)._M_elems[0x18] = '\0';
    (pbVar1->m_data)._M_elems[0x19] = '\0';
    (pbVar1->m_data)._M_elems[0x1a] = '\0';
    (pbVar1->m_data)._M_elems[0x1b] = '\0';
    (pbVar1->m_data)._M_elems[0x1c] = '\0';
    (pbVar1->m_data)._M_elems[0x1d] = '\0';
    (pbVar1->m_data)._M_elems[0x1e] = '\0';
    (pbVar1->m_data)._M_elems[0x1f] = '\0';
  }
  else {
    puVar3 = (uint32_t *)&HASHER_TAPTWEAK;
    pCVar4 = &CStack_88;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pCVar4 = *(undefined8 *)puVar3;
      puVar3 = puVar3 + 2;
      pCVar4 = (CSHA256 *)((long)pCVar4 + 8);
    }
    CSHA256::Write(&CStack_88,(uchar *)this,0x20);
    CSHA256::Write(&CStack_88,(uchar *)merkle_root,0x20);
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar1->m_data)._M_elems[8] = '\0';
    (pbVar1->m_data)._M_elems[9] = '\0';
    (pbVar1->m_data)._M_elems[10] = '\0';
    (pbVar1->m_data)._M_elems[0xb] = '\0';
    (pbVar1->m_data)._M_elems[0xc] = '\0';
    (pbVar1->m_data)._M_elems[0xd] = '\0';
    (pbVar1->m_data)._M_elems[0xe] = '\0';
    (pbVar1->m_data)._M_elems[0xf] = '\0';
    pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar1->m_data)._M_elems[0x10] = '\0';
    (pbVar1->m_data)._M_elems[0x11] = '\0';
    (pbVar1->m_data)._M_elems[0x12] = '\0';
    (pbVar1->m_data)._M_elems[0x13] = '\0';
    (pbVar1->m_data)._M_elems[0x14] = '\0';
    (pbVar1->m_data)._M_elems[0x15] = '\0';
    (pbVar1->m_data)._M_elems[0x16] = '\0';
    (pbVar1->m_data)._M_elems[0x17] = '\0';
    pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar1->m_data)._M_elems[0x18] = '\0';
    (pbVar1->m_data)._M_elems[0x19] = '\0';
    (pbVar1->m_data)._M_elems[0x1a] = '\0';
    (pbVar1->m_data)._M_elems[0x1b] = '\0';
    (pbVar1->m_data)._M_elems[0x1c] = '\0';
    (pbVar1->m_data)._M_elems[0x1d] = '\0';
    (pbVar1->m_data)._M_elems[0x1e] = '\0';
    (pbVar1->m_data)._M_elems[0x1f] = '\0';
  }
  CSHA256::Finalize(&CStack_88,(uchar *)__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 XOnlyPubKey::ComputeTapTweakHash(const uint256* merkle_root) const
{
    if (merkle_root == nullptr) {
        // We have no scripts. The actual tweak does not matter, but follow BIP341 here to
        // allow for reproducible tweaking.
        return (HashWriter{HASHER_TAPTWEAK} << m_keydata).GetSHA256();
    } else {
        return (HashWriter{HASHER_TAPTWEAK} << m_keydata << *merkle_root).GetSHA256();
    }
}